

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffers.c
# Opt level: O3

int ffldrc(fitsfile *fptr,long record,int err_mode,int *status)

{
  int iVar1;
  ulong uVar2;
  FITSfile *Fptr;
  long position;
  long lVar3;
  uint nbuff;
  
  Fptr = fptr->Fptr;
  if (fptr->HDUposition != Fptr->curhdu) {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
    Fptr = fptr->Fptr;
  }
  uVar2 = 0x27;
  do {
    iVar1 = (int)uVar2;
    nbuff = Fptr->ageindex[uVar2];
    if (Fptr->bufrecnum[(int)nbuff] == record) {
      Fptr->curbuf = nbuff;
      goto LAB_00124abf;
    }
    uVar2 = (ulong)(iVar1 - 1);
  } while (iVar1 != 0);
  position = record * 0xb40;
  if ((err_mode == 0) && (Fptr->logfilesize <= position)) {
    *status = 0x6b;
    return 0x6b;
  }
  nbuff = Fptr->ageindex[0];
  uVar2 = (ulong)nbuff;
  if ((int)nbuff < 0) {
    *status = 0x67;
    return 0x67;
  }
  if (Fptr->dirty[uVar2] != 0) {
    ffbfwt(Fptr,nbuff,status);
    Fptr = fptr->Fptr;
  }
  if (position < Fptr->filesize) {
    if (Fptr->io_pos != position) {
      ffseek(Fptr,position);
      Fptr = fptr->Fptr;
    }
    ffread(Fptr,0xb40,Fptr->iobuffer + uVar2 * 0xb40,status);
    Fptr = fptr->Fptr;
    Fptr->io_pos = position + 0xb40;
  }
  else {
    if (Fptr->hdutype == 1) {
      iVar1 = 0x20;
    }
    else {
      iVar1 = 0;
    }
    memset(Fptr->iobuffer + uVar2 * 0xb40,iVar1,0xb40);
    Fptr = fptr->Fptr;
    lVar3 = position + 0xb40;
    if (position + 0xb40 < Fptr->logfilesize) {
      lVar3 = Fptr->logfilesize;
    }
    Fptr->logfilesize = lVar3;
    Fptr->dirty[uVar2] = 1;
  }
  Fptr->bufrecnum[uVar2] = record;
  Fptr->curbuf = nbuff;
  uVar2 = 0;
  do {
    if (Fptr->ageindex[uVar2] == nbuff) goto LAB_00124abf;
    uVar2 = uVar2 + 1;
  } while (uVar2 != 0x28);
LAB_00124b85:
  Fptr->ageindex[0x27] = nbuff;
  return *status;
LAB_00124abf:
  if ((uint)uVar2 < 0x27) {
    uVar2 = uVar2 & 0xffffffff;
    do {
      Fptr->ageindex[uVar2] = Fptr->ageindex[uVar2 + 1];
      uVar2 = uVar2 + 1;
    } while (uVar2 != 0x27);
  }
  goto LAB_00124b85;
}

Assistant:

int ffldrc(fitsfile *fptr,        /* I - FITS file pointer             */
           long record,           /* I - record number to be loaded    */
           int err_mode,          /* I - 1=ignore EOF, 0 = return EOF error */
           int *status)           /* IO - error status                 */
{
/*
  low-level routine to load a specified record from a file into
  a physical buffer, if it is not already loaded.  Reset all
  pointers to make this the new current record for that file.
  Update ages of all the physical buffers.
*/
    int ibuff, nbuff;
    LONGLONG rstart;

    /* check if record is already loaded in one of the buffers */
    /* search from youngest to oldest buffer for efficiency */

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    for (ibuff = NIOBUF - 1; ibuff >= 0; ibuff--)
    {
      nbuff = (fptr->Fptr)->ageindex[ibuff];
      if (record == (fptr->Fptr)->bufrecnum[nbuff]) {
         goto updatebuf;  /* use 'goto' for efficiency */
      }
    }

    /* record is not already loaded */
    rstart = (LONGLONG)record * IOBUFLEN;

    if ( !err_mode && (rstart >= (fptr->Fptr)->logfilesize) )  /* EOF? */
         return(*status = END_OF_FILE);

    if (ffwhbf(fptr, &nbuff) < 0)  /* which buffer should we reuse? */
       return(*status = TOO_MANY_FILES); 

    if ((fptr->Fptr)->dirty[nbuff])
       ffbfwt(fptr->Fptr, nbuff, status); /* write dirty buffer to disk */

    if (rstart >= (fptr->Fptr)->filesize)  /* EOF? */
    {
      /* initialize an empty buffer with the correct fill value */
      if ((fptr->Fptr)->hdutype == ASCII_TBL)
         memset((fptr->Fptr)->iobuffer + (nbuff * IOBUFLEN), 32, IOBUFLEN); /* blank fill */
      else
         memset((fptr->Fptr)->iobuffer + (nbuff * IOBUFLEN),  0, IOBUFLEN);  /* zero fill */

      (fptr->Fptr)->logfilesize = maxvalue((fptr->Fptr)->logfilesize, 
              rstart + IOBUFLEN);

      (fptr->Fptr)->dirty[nbuff] = TRUE;  /* mark record as having been modified */
    }
    else  /* not EOF, so read record from disk */
    {
      if ((fptr->Fptr)->io_pos != rstart)
           ffseek(fptr->Fptr, rstart);

      ffread(fptr->Fptr, IOBUFLEN, (fptr->Fptr)->iobuffer + (nbuff * IOBUFLEN), status);
      (fptr->Fptr)->io_pos = rstart + IOBUFLEN;  /* set new IO position */
    }

    (fptr->Fptr)->bufrecnum[nbuff] = record;   /* record number contained in buffer */

updatebuf:

    (fptr->Fptr)->curbuf = nbuff; /* this is the current buffer for this file */

    if (ibuff < 0)
    { 
      /* find the current position of the buffer in the age index */
      for (ibuff = 0; ibuff < NIOBUF; ibuff++)
         if ((fptr->Fptr)->ageindex[ibuff] == nbuff)
            break;  
    }

    /* increment the age of all the buffers that were younger than it */
    for (ibuff++; ibuff < NIOBUF; ibuff++)
      (fptr->Fptr)->ageindex[ibuff - 1] = (fptr->Fptr)->ageindex[ibuff];

    (fptr->Fptr)->ageindex[NIOBUF - 1] = nbuff; /* this is now the youngest buffer */
    return(*status);
}